

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O1

void __thiscall QCachedPainter::~QCachedPainter(QCachedPainter *this)

{
  Data *pDVar1;
  
  finish(this);
  if (this->m_alreadyCached == false) {
    QPixmapCache::insert((QString *)&this->m_pixmapName,&this->m_pixmap);
  }
  QPixmap::~QPixmap(&this->m_pixmap);
  pDVar1 = (this->m_pixmapName).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_pixmapName).d.d)->super_QArrayData,2,0x10);
    }
  }
  std::unique_ptr<QPainter,_std::default_delete<QPainter>_>::~unique_ptr(&this->m_pixmapPainter);
  return;
}

Assistant:

QCachedPainter::~QCachedPainter()
{
    finish();
    if (!m_alreadyCached)
        QPixmapCache::insert(m_pixmapName, m_pixmap);
}